

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O0

void __thiscall Worker::prepare_containers(Worker *this)

{
  bool bVar1;
  uid_t uVar2;
  pid_t pVar3;
  reference ppTVar4;
  vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *pvVar5;
  Container *pCVar6;
  reference this_00;
  ContextManager *pCVar7;
  string local_80;
  pointer local_60 [3];
  Container *local_48;
  Container *created_container;
  Task *pTStack_38;
  bool permanent_container_allowed;
  Task *task;
  iterator __end1;
  iterator __begin1;
  vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *__range1;
  size_t next_permanent_container;
  Worker *this_local;
  
  __range1 = (vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *)0x0;
  __end1 = std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>::begin(&this->tasks_);
  task = (Task *)std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>::end(&this->tasks_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<libsbox::Task_**,_std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>_>
                                     *)&task), bVar1) {
    ppTVar4 = __gnu_cxx::
              __normal_iterator<libsbox::Task_**,_std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>_>
              ::operator*(&__end1);
    pTStack_38 = *ppTVar4;
    created_container._7_1_ = 1;
    bVar1 = libsbox::Task::get_need_ipc(pTStack_38);
    if ((bVar1) || (bVar1 = libsbox::Task::get_use_standard_binds(pTStack_38), !bVar1)) {
      created_container._7_1_ = 0;
    }
    local_48 = (Container *)0x0;
    if ((created_container._7_1_ & 1) == 0) {
      pCVar6 = (Container *)operator_new(200);
      uVar2 = SharedIdGetter::get(this->id_getter_);
      Container::Container(pCVar6,uVar2,false);
      local_48 = pCVar6;
      std::
      vector<std::unique_ptr<Container,std::default_delete<Container>>,std::allocator<std::unique_ptr<Container,std::default_delete<Container>>>>
      ::emplace_back<Container*&>
                ((vector<std::unique_ptr<Container,std::default_delete<Container>>,std::allocator<std::unique_ptr<Container,std::default_delete<Container>>>>
                  *)&this->temporary_containers_,&local_48);
      std::vector<Container_*,_std::allocator<Container_*>_>::push_back
                (&this->containers_,&local_48);
    }
    else {
      pvVar5 = (vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *)
               std::
               vector<std::unique_ptr<Container,_std::default_delete<Container>_>,_std::allocator<std::unique_ptr<Container,_std::default_delete<Container>_>_>_>
               ::size(&this->permanent_containers_);
      if (__range1 == pvVar5) {
        pCVar6 = (Container *)operator_new(200);
        uVar2 = SharedIdGetter::get(this->id_getter_);
        Container::Container(pCVar6,uVar2,true);
        local_48 = pCVar6;
        std::
        vector<std::unique_ptr<Container,std::default_delete<Container>>,std::allocator<std::unique_ptr<Container,std::default_delete<Container>>>>
        ::emplace_back<Container*&>
                  ((vector<std::unique_ptr<Container,std::default_delete<Container>>,std::allocator<std::unique_ptr<Container,std::default_delete<Container>>>>
                    *)&this->permanent_containers_,&local_48);
      }
      this_00 = std::
                vector<std::unique_ptr<Container,_std::default_delete<Container>_>,_std::allocator<std::unique_ptr<Container,_std::default_delete<Container>_>_>_>
                ::operator[](&this->permanent_containers_,(size_type)__range1);
      local_60[0] = std::unique_ptr<Container,_std::default_delete<Container>_>::get(this_00);
      std::vector<Container_*,_std::allocator<Container_*>_>::push_back(&this->containers_,local_60)
      ;
      __range1 = (vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *)
                 ((long)&(__range1->
                         super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1);
    }
    if ((local_48 != (Container *)0x0) && (pVar3 = Container::start(local_48), pVar3 < 0)) {
      pCVar7 = ContextManager::get();
      format_abi_cxx11_(&local_80,"Cannot start() container: %m");
      (**pCVar7->_vptr_ContextManager)(pCVar7,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    __gnu_cxx::
    __normal_iterator<libsbox::Task_**,_std::vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Worker::prepare_containers() {
    size_t next_permanent_container = 0;
    for (auto task : tasks_) {
        bool permanent_container_allowed = true;
        if (task->get_need_ipc() || !task->get_use_standard_binds()) {
            permanent_container_allowed = false;
        }

        Container *created_container = nullptr;
        if (permanent_container_allowed) {
            if (next_permanent_container == permanent_containers_.size()) {
                created_container = new Container(id_getter_->get(), true);
                permanent_containers_.emplace_back(created_container);
            }
            containers_.push_back(permanent_containers_[next_permanent_container].get());
            next_permanent_container++;
        } else {
            created_container = new Container(id_getter_->get(), false);
            temporary_containers_.emplace_back(created_container);
            containers_.push_back(created_container);
        }

        if (created_container != nullptr) {
            if (created_container->start() < 0) {
                die(format("Cannot start() container: %m"));
            }
        }
    }
}